

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-options.c
# Opt level: O2

void do_cmd_options_win(char *name,wchar_t row)

{
  wchar_t a;
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  size_t sVar6;
  uint uVar7;
  wchar_t c;
  uint uVar8;
  wchar_t wVar9;
  ulong uVar10;
  char *s;
  uint uVar11;
  uint uVar12;
  char (*__s) [16];
  wchar_t y;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ui_event uVar16;
  keypress ch;
  uint32_t flag;
  uint32_t new_flags [8];
  
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    new_flags[lVar5] = window_flag[lVar5];
  }
  screen_save();
  clear_from(L'\0');
  uVar12 = 0;
  uVar8 = 0;
LAB_001ebd1e:
  do {
    uVar7 = uVar8;
    uVar11 = uVar12;
    uVar15 = (ulong)uVar11;
    uVar2 = 1 << ((byte)uVar7 & 0x1f);
    bVar1 = (byte)uVar7 & 0x1f;
    uVar3 = -2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1;
LAB_001ebd54:
    do {
      while( true ) {
        prt("Window flags (<dir> to move, \'t\'/Enter to toggle, or ESC)",L'\0',L'\0');
        __s = angband_term_name;
        iVar14 = 0x23;
        for (uVar13 = 0; uVar13 != 8; uVar13 = uVar13 + 1) {
          wVar9 = L'\x01';
          if (uVar15 == uVar13) {
            wVar9 = L'\x0e';
          }
          sVar6 = strlen(*__s);
          Term_putstr(iVar14 - (int)(sVar6 >> 1),(uint)uVar13 & 1 | 2,L'\xffffffff',wVar9,*__s);
          iVar14 = iVar14 + 5;
          __s = __s + 1;
        }
        for (uVar13 = 0; uVar13 != 0x10; uVar13 = uVar13 + 1) {
          s = window_flag_desc[uVar13];
          wVar9 = L'\x01';
          if (uVar13 == uVar7) {
            wVar9 = L'\x0e';
          }
          if (s == (char *)0x0) {
            s = "(Unused option)";
          }
          y = (int)uVar13 + L'\x05';
          Term_putstr(L'\0',y,L'\xffffffff',wVar9,s);
          wVar9 = L'#';
          for (uVar10 = 0; uVar10 != 8; uVar10 = uVar10 + 1) {
            a = L'\x01';
            if (uVar15 == uVar10 && uVar13 == uVar7) {
              a = L'\x0e';
            }
            c = L'.';
            if ((new_flags[uVar10] & 1 << ((byte)uVar13 & 0x1f)) != 0) {
              c = L'X';
            }
            Term_putch(wVar9,y,a,c);
            wVar9 = wVar9 + L'\x05';
          }
        }
        Term_gotoxy(uVar11 * 5 + L'#',uVar7 + L'\x05');
        uVar16 = inkey_ex();
        uVar13 = uVar16._0_8_;
        uVar12 = uVar16.key.code;
        if (uVar16.type == EVT_KBRD) break;
        if (uVar16.type == EVT_MOUSE) {
          uVar4 = (uVar12 & 0xff) - 0x23;
          if ((uVar13 & 0xff000000000000) == 0x2000000000000) {
LAB_001ebfdd:
            subwindows_set_flags(new_flags,8);
            screen_load();
            return;
          }
          if ((((char)(((ushort)uVar16.key.code & 0xff) % 5) == '\0') &&
              (uVar8 = (uVar12 >> 8 & 0xff) - 5, uVar8 < 0x10)) && ((uVar12 & 0xff) - 0x28 < 0x23))
          {
            uVar12 = (uint)(short)((int)((uint)(ushort)((short)uVar4 >> 0xf) << 0x10 |
                                        uVar4 & 0xffff) / 5);
            if ((uVar8 != uVar7) || (uVar11 != uVar12)) goto LAB_001ebd1e;
            uVar12 = new_flags[uVar15];
            uVar8 = uVar12 & uVar3;
            if ((uVar12 & uVar2) == 0) {
              uVar8 = uVar12 | uVar2;
            }
            new_flags[uVar15] = uVar8;
          }
        }
      }
      if (((uVar13 >> 0x20 == 0x35) || (uVar12 == 0x74)) || (uVar12 == 0x9c)) {
        if (uVar15 == 0) {
          bell();
        }
        else {
          uVar12 = new_flags[(int)uVar11];
          if ((uVar12 & uVar2) == 0) {
            new_flags[(int)uVar11] = uVar12 | uVar2;
          }
          else {
            new_flags[(int)uVar11] = uVar12 & uVar3;
          }
        }
        goto LAB_001ebd54;
      }
      if ((uVar12 == 0x71) || (uVar12 == 0xe000)) goto LAB_001ebfdd;
      ch._8_4_ = uVar16._8_4_ & 0xff;
      ch.type = (int)uVar13;
      ch.code = (int)(uVar13 >> 0x20);
      wVar9 = target_dir(ch);
    } while (wVar9 == L'\0');
    uVar12 = (int)((int)ddx[wVar9] + uVar11 + 8) % 8;
    uVar8 = (int)(uVar7 + 0x10 + (int)ddy[wVar9]) % 0x10;
  } while( true );
}

Assistant:

static void do_cmd_options_win(const char *name, int row)
{
	int i, j, d;
	int y = 0;
	int x = 0;
	ui_event ke;
	uint32_t new_flags[ANGBAND_TERM_MAX];

	/* Set new flags to the old values */
	for (j = 0; j < ANGBAND_TERM_MAX; j++)
		new_flags[j] = window_flag[j];

	/* Clear screen */
	screen_save();
	clear_from(0);

	/* Interact */
	while (1) {
		/* Prompt */
		prt("Window flags (<dir> to move, 't'/Enter to toggle, or ESC)", 0, 0);

		/* Display the windows */
		for (j = 0; j < ANGBAND_TERM_MAX; j++) {
			uint8_t a = COLOUR_WHITE;

			const char *s = angband_term_name[j];

			/* Use color */
			if (j == x) a = COLOUR_L_BLUE;

			/* Window name, staggered, centered */
			Term_putstr(35 + j * 5 - strlen(s) / 2, 2 + j % 2, -1, a, s);
		}

		/* Display the options */
		for (i = 0; i < PW_MAX_FLAGS; i++) {
			uint8_t a = COLOUR_WHITE;

			const char *str = window_flag_desc[i];

			/* Use color */
			if (i == y) a = COLOUR_L_BLUE;

			/* Unused option */
			if (!str) str = "(Unused option)";

			/* Flag name */
			Term_putstr(0, i + 5, -1, a, str);

			/* Display the windows */
			for (j = 0; j < ANGBAND_TERM_MAX; j++) {
				wchar_t c = L'.';

				a = COLOUR_WHITE;

				/* Use color */
				if ((i == y) && (j == x)) a = COLOUR_L_BLUE;

				/* Active flag */
				if (new_flags[j] & ((uint32_t) 1 << i)) c = L'X';

				/* Flag value */
				Term_putch(35 + j * 5, i + 5, a, c);
			}
		}

		/* Place Cursor */
		Term_gotoxy(35 + x * 5, y + 5);

		/* Get key */
		ke = inkey_ex();

		/* Mouse or keyboard interaction */
		if (ke.type == EVT_MOUSE) {
			int choicey = ke.mouse.y - 5;
			int choicex = (ke.mouse.x - 35)/5;

			if (ke.mouse.button == 2)
				break;

			if ((choicey >= 0) && (choicey < PW_MAX_FLAGS)
				&& (choicex > 0) && (choicex < ANGBAND_TERM_MAX)
				&& !(ke.mouse.x % 5)) {
				if ((choicey == y) && (choicex == x)) {
					uint32_t flag = ((uint32_t) 1) << y;

					/* Toggle flag (off) */
					if (new_flags[x] & flag)
						new_flags[x] &= ~flag;
					/* Toggle flag (on) */
					else
						new_flags[x] |= flag;
				} else {
					y = choicey;
					x = (ke.mouse.x - 35)/5;
				}
			}
		} else if (ke.type == EVT_KBRD) {
			if (ke.key.code == ESCAPE || ke.key.code == 'q')
				break;

			/* Toggle */
			else if (ke.key.code == '5' || ke.key.code == 't' ||
					ke.key.code == KC_ENTER) {
				/* Hack -- ignore the main window */
				if (x == 0)
					bell();

				/* Toggle flag (off) */
				else if (new_flags[x] & (((uint32_t) 1) << y))
					new_flags[x] &= ~(((uint32_t) 1) << y);

				/* Toggle flag (on) */
				else
					new_flags[x] |= (((uint32_t) 1) << y);

				/* Continue */
				continue;
			}

			/* Extract direction */
			d = target_dir(ke.key);

			/* Move */
			if (d != 0) {
				x = (x + ddx[d] + 8) % ANGBAND_TERM_MAX;
				y = (y + ddy[d] + 16) % PW_MAX_FLAGS;
			}
		}
	}

	/* Notice changes */
	subwindows_set_flags(new_flags, ANGBAND_TERM_MAX);

	screen_load();
}